

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void CheckReadInt<short>(char code)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *message;
  char code_local;
  Type_conflict1 max;
  short min;
  string gtest_expected_message;
  allocator<char> local_131;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_1;
  string local_100;
  AssertionResult gtest_ar;
  double local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  code_local = code;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_3,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ",
             (allocator<char> *)&gtest_ar_1);
  std::operator+(&gtest_expected_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
                 "c0: 4;");
  fmt::format<char>(&local_58,(CStringRef)0x21c2b4,&code_local);
  ReadNL(&local_100,&local_58,true);
  pbVar2 = &local_100;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"c0: 4;\"",
             "ReadNL(fmt::format(\"C0\\n{}4.2\\n\", code))",&gtest_expected_message,pbVar2);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x22bdba;
    }
    else {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x457,(char *)pbVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_3,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  min = -0x8000;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_3,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ",
             (allocator<char> *)&max);
  local_c0 = (double)(int)min;
  fmt::format<double>(&local_100,(CStringRef)0x21c34b,&local_c0);
  std::operator+(&gtest_expected_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
                 &local_100);
  fmt::format<char,short>
            (&local_78,(fmt *)"C0\n{}{}\n",(CStringRef)&code_local,(char *)&min,(short *)pbVar2);
  ReadNL((string *)&gtest_ar,&local_78,true);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + fmt::format(\"c0: {};\", min + 0.)"
             ,"ReadNL(fmt::format(\"C0\\n{}{}\\n\", code, min))",&gtest_expected_message,pbVar2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x22bdba;
    }
    else {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x45a,(char *)pbVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_3,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  max = 0x7fff;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_3,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ",&local_131);
  local_c0 = (double)max;
  fmt::format<double>(&local_100,(CStringRef)0x21c34b,&local_c0);
  std::operator+(&gtest_expected_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_3,
                 &local_100);
  fmt::format<char,unsigned_short>
            (&local_98,(fmt *)"C0\n{}{}\n",(CStringRef)&code_local,(char *)&max,
             (unsigned_short *)pbVar2);
  ReadNL((string *)&gtest_ar,&local_98,true);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + fmt::format(\"c0: {};\", max + 0.)"
             ,"ReadNL(fmt::format(\"C0\\n{}{}\\n\", code, max))",&gtest_expected_message,pbVar2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x22bdba;
    }
    else {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x45d,(char *)pbVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_3,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  testing::AssertionSuccess();
  if (gtest_ar_3.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"(input):18:2: number is too big",
               (allocator<char> *)&local_100);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_100._M_dataplus._M_p._0_4_ = max + 1;
      fmt::format<char,int>
                (&local_b8,(fmt *)"C0\n{}{}\n",(CStringRef)&code_local,(char *)&local_100,
                 (int *)pbVar2);
      ReadNL(&local_38,&local_b8,true);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_3,
               (char (*) [127])
               "Expected: ReadNL(fmt::format(\"C0\\n{}{}\\n\", code, max + 1)) throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar_3.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x45f,message);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_100,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  return;
}

Assistant:

void CheckReadInt(char code) {
  EXPECT_READ("c0: 4;", fmt::format("C0\n{}4.2\n", code));
  Int min = std::numeric_limits<Int>::min();
  EXPECT_READ(fmt::format("c0: {};", min + 0.),
               fmt::format("C0\n{}{}\n", code, min));
  typename mp::MakeUnsigned<Int>::Type max = std::numeric_limits<Int>::max();
  EXPECT_READ(fmt::format("c0: {};", max + 0.),
               fmt::format("C0\n{}{}\n", code, max));
  EXPECT_READ_ERROR(fmt::format("C0\n{}{}\n", code, max + 1),
    "(input):18:2: number is too big");
}